

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvawatch.c
# Opt level: O0

void * watchfun(void *x)

{
  uint32_t uVar1;
  uint uVar2;
  uint local_14;
  uint32_t nval;
  uint32_t val;
  void *x_local;
  
  local_14 = nva_rd32(cnum,a);
  queue[put] = local_14;
  put = (put + 1) % 0x100000;
  do {
    do {
      uVar1 = nva_rd32(cnum,a);
      uVar2 = local_14 & mask;
      local_14 = uVar1;
    } while ((uVar1 & mask) == uVar2);
    queue[put] = uVar1;
    put = (put + 1) % 0x100000;
  } while( true );
}

Assistant:

void *watchfun(void *x) {
	uint32_t val = nva_rd32(cnum, a);
	queue[put] = val;
	put = (put + 1) % SZ;
	while (1) {
		uint32_t nval = nva_rd32(cnum, a);
		if ((nval & mask) != (val & mask)) {
			queue[put] = nval;
			put = (put + 1) % SZ;
		}
		val = nval;
	}
}